

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int lua_yieldk(lua_State *L,int nresults,lua_KContext ctx,lua_KFunction k)

{
  CallInfo *pCVar1;
  int iVar2;
  CallInfo *ci;
  lua_KFunction k_local;
  lua_KContext ctx_local;
  int nresults_local;
  lua_State *L_local;
  
  pCVar1 = L->ci;
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x324,"int lua_yieldk(lua_State *, int, lua_KContext, lua_KFunction)");
  }
  if ((long)L->top - (long)L->ci->func >> 4 <= (long)nresults) {
    __assert_fail("((nresults) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x325,"int lua_yieldk(lua_State *, int, lua_KContext, lua_KFunction)");
  }
  if (L->nny != 0) {
    if (L == L->l_G->mainthread) {
      luaG_runerror(L,"attempt to yield from outside a coroutine");
    }
    luaG_runerror(L,"attempt to yield across a C-call boundary");
  }
  L->status = '\x01';
  pCVar1->extra = (long)pCVar1->func - (long)L->stack;
  if ((pCVar1->callstatus & 2) != 0) {
    if (k != (lua_KFunction)0x0) {
      __assert_fail("(k == ((void*)0)) && \"hooks cannot continue after yielding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x32f,"int lua_yieldk(lua_State *, int, lua_KContext, lua_KFunction)");
    }
    if ((pCVar1->callstatus & 4) != 0) {
      iVar2 = **(int **)&L[-1].hookmask + -1;
      **(int **)&L[-1].hookmask = iVar2;
      if (iVar2 != 0) {
        __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x338,"int lua_yieldk(lua_State *, int, lua_KContext, lua_KFunction)");
      }
      return 0;
    }
    __assert_fail("ci->callstatus & (1<<2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x337,"int lua_yieldk(lua_State *, int, lua_KContext, lua_KFunction)");
  }
  (pCVar1->u).c.k = k;
  if (k != (lua_KFunction)0x0) {
    (pCVar1->u).c.ctx = ctx;
  }
  pCVar1->func = L->top + (-1 - (long)nresults);
  luaD_throw(L,1);
}

Assistant:

LUA_API int lua_yieldk (lua_State *L, int nresults, lua_KContext ctx,
                        lua_KFunction k) {
  CallInfo *ci = L->ci;
  luai_userstateyield(L, nresults);
  lua_lock(L);
  api_checknelems(L, nresults);
  if (L->nny > 0) {
    if (L != G(L)->mainthread)
      luaG_runerror(L, "attempt to yield across a C-call boundary");
    else
      luaG_runerror(L, "attempt to yield from outside a coroutine");
  }
  L->status = LUA_YIELD;
  ci->extra = savestack(L, ci->func);  /* save current 'func' */
  if (isLua(ci)) {  /* inside a hook? */
    api_check(L, k == NULL, "hooks cannot continue after yielding");
  }
  else {
    if ((ci->u.c.k = k) != NULL)  /* is there a continuation? */
      ci->u.c.ctx = ctx;  /* save context */
    ci->func = L->top - nresults - 1;  /* protect stack below results */
    luaD_throw(L, LUA_YIELD);
  }
  lua_assert(ci->callstatus & CIST_HOOKED);  /* must be inside a hook */
  lua_unlock(L);
  return 0;  /* return to 'luaD_hook' */
}